

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O1

Elf64_Phdr * __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::GetPhdr(ElfMemImage *this,int index)

{
  ushort uVar1;
  uint uVar2;
  Elf64_Ehdr *pEVar3;
  ulong uVar4;
  long lVar5;
  Elf64_Phdr *pEVar6;
  Elf64_Phdr *pEVar7;
  undefined4 in_register_00000034;
  
  if ((-1 < index) && (pEVar3 = this->ehdr_, index < (int)(uint)pEVar3->e_phnum)) {
    return (Elf64_Phdr *)
           (pEVar3->e_ident + (ulong)(uint)index * (ulong)pEVar3->e_phentsize + pEVar3->e_phoff);
  }
  GetPhdr();
  if ((ulong)(uint)index < this->strsize_) {
    return (Elf64_Phdr *)(this->dynstr_ + (uint)index);
  }
  GetDynstr();
  if ((ushort)(*(short *)(CONCAT44(in_register_00000034,index) + 6) + 0x100U) < 0x101) {
    return *(Elf64_Phdr **)(CONCAT44(in_register_00000034,index) + 8);
  }
  uVar4 = *(ulong *)(CONCAT44(in_register_00000034,index) + 8);
  lVar5 = uVar4 - this->link_base_;
  if (this->link_base_ <= uVar4 && lVar5 != 0) {
    return (Elf64_Phdr *)(lVar5 + (long)this->ehdr_);
  }
  GetSymAddr();
  if ((-1 < index) && ((ulong)(uint)index <= this->verdefnum_)) {
    pEVar7 = (Elf64_Phdr *)this->verdef_;
    uVar1 = (ushort)pEVar7->p_flags;
    for (; ((int)(uint)uVar1 < index && (uVar2 = (uint)pEVar7->p_vaddr, uVar2 != 0));
        pEVar7 = (Elf64_Phdr *)((long)&pEVar7->p_type + (ulong)uVar2)) {
      uVar1 = *(ushort *)((long)&pEVar7->p_flags + (ulong)uVar2);
    }
    pEVar6 = (Elf64_Phdr *)0x0;
    if ((uint)uVar1 == index) {
      pEVar6 = pEVar7;
    }
    return pEVar6;
  }
  GetVerdef();
  return (Elf64_Phdr *)(CONCAT44(in_register_00000034,index) + 0x14);
}

Assistant:

const ElfW(Phdr) *ElfMemImage::GetPhdr(int index) const {
  ABSL_RAW_CHECK(index >= 0 && index < ehdr_->e_phnum, "index out of range");
  return GetTableElement<ElfW(Phdr)>(ehdr_, ehdr_->e_phoff, ehdr_->e_phentsize,
                                     static_cast<size_t>(index));
}